

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Abc_NtkFxCheck(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar2 = (long)pNtk->vObjs->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar3];
      if (((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) &&
         (uVar4 = (ulong)*(int *)((long)pvVar1 + 0x1c), 0 < (long)uVar4)) {
        uVar5 = 1;
        uVar6 = 0;
        do {
          uVar7 = uVar6 + 1;
          if (uVar7 < uVar4) {
            uVar8 = uVar5;
            do {
              if (*(int *)(*(long *)((long)pvVar1 + 0x20) + uVar6 * 4) ==
                  *(int *)(*(long *)((long)pvVar1 + 0x20) + uVar8 * 4)) {
                return 0;
              }
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
          uVar5 = uVar5 + 1;
          uVar6 = uVar7;
        } while (uVar7 != uVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar2);
  }
  return 1;
}

Assistant:

int Abc_NtkFxCheck( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
//    Abc_NtkForEachObj( pNtk, pNode, i )
//        Abc_ObjPrint( stdout, pNode );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Vec_IntCheckUniqueSmall( &pNode->vFanins ) )
            return 0;
    return 1;
}